

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O2

void decaf_ed25519_convert_private_key_to_x25519(uint8_t *x,uint8_t *ed)

{
  size_t in_RCX;
  
  decaf_sha512_hash(x,0x20,ed,in_RCX);
  return;
}

Assistant:

void decaf_ed25519_convert_private_key_to_x25519 (
    uint8_t x[DECAF_X25519_PRIVATE_BYTES],
    const uint8_t ed[DECAF_EDDSA_25519_PRIVATE_BYTES]
) {
    /* pass the private key through hash_hash function */
    /* and keep the first DECAF_X25519_PRIVATE_BYTES bytes */
    hash_hash(
        x,
        DECAF_X25519_PRIVATE_BYTES,
        ed,
        DECAF_EDDSA_25519_PRIVATE_BYTES
    );
}